

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode add_next_timeout(curltime now,Curl_multi *multi,Curl_easy *d)

{
  Curl_llist *list;
  Curl_llist_element *pCVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  timediff_t tVar5;
  void *pvVar6;
  Curl_llist_element *e;
  curltime newer;
  curltime i;
  curltime older;
  
  list = &(d->state).timeoutlist;
  pvVar6 = (void *)0x0;
  e = (d->state).timeoutlist.head;
  while (e != (Curl_llist_element *)0x0) {
    pvVar6 = e->ptr;
    pCVar1 = e->next;
    newer._12_4_ = 0;
    newer._0_12_ = *(undefined1 (*) [12])((long)pvVar6 + 0x18);
    older._8_8_ = now._8_8_ & 0xffffffff;
    older.tv_sec = now.tv_sec;
    tVar5 = Curl_timediff_us(newer,older);
    if (0 < tVar5) break;
    Curl_llist_remove(list,e,(void *)0x0);
    e = pCVar1;
  }
  if (list->head == (Curl_llist_element *)0x0) {
    (d->state).expiretime.tv_sec = 0;
    (d->state).expiretime.tv_usec = 0;
  }
  else {
    uVar4 = *(undefined8 *)((long)pvVar6 + 0x20);
    (d->state).expiretime.tv_sec = *(time_t *)((long)pvVar6 + 0x18);
    *(undefined8 *)&(d->state).expiretime.tv_usec = uVar4;
    uVar2 = (d->state).expiretime.tv_sec;
    uVar3 = (d->state).expiretime.tv_usec;
    i.tv_usec = uVar3;
    i.tv_sec = uVar2;
    i._12_4_ = 0;
    d = (Curl_easy *)Curl_splayinsert(i,multi->timetree,&(d->state).timenode);
    multi->timetree = (Curl_tree *)d;
  }
  return (CURLMcode)d;
}

Assistant:

static CURLMcode add_next_timeout(struct curltime now,
                                  struct Curl_multi *multi,
                                  struct Curl_easy *d)
{
  struct curltime *tv = &d->state.expiretime;
  struct Curl_llist *list = &d->state.timeoutlist;
  struct Curl_llist_element *e;
  struct time_node *node = NULL;

  /* move over the timeout list for this specific handle and remove all
     timeouts that are now passed tense and store the next pending
     timeout in *tv */
  for(e = list->head; e;) {
    struct Curl_llist_element *n = e->next;
    timediff_t diff;
    node = (struct time_node *)e->ptr;
    diff = Curl_timediff_us(node->time, now);
    if(diff <= 0)
      /* remove outdated entry */
      Curl_llist_remove(list, e, NULL);
    else
      /* the list is sorted so get out on the first mismatch */
      break;
    e = n;
  }
  e = list->head;
  if(!e) {
    /* clear the expire times within the handles that we remove from the
       splay tree */
    tv->tv_sec = 0;
    tv->tv_usec = 0;
  }
  else {
    /* copy the first entry to 'tv' */
    memcpy(tv, &node->time, sizeof(*tv));

    /* Insert this node again into the splay.  Keep the timer in the list in
       case we need to recompute future timers. */
    multi->timetree = Curl_splayinsert(*tv, multi->timetree,
                                       &d->state.timenode);
  }
  return CURLM_OK;
}